

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_stats.hpp
# Opt level: O0

string * __thiscall
duckdb::NumericStatisticsState<duckdb::float_na_equal,float,duckdb::BaseParquetOperator>::
GetMaxValue_abi_cxx11_
          (NumericStatisticsState<duckdb::float_na_equal,_float,_duckdb::BaseParquetOperator> *this)

{
  ulong uVar1;
  char *pcVar2;
  long *in_RSI;
  string *in_RDI;
  allocator local_11 [17];
  
  uVar1 = (**(code **)(*in_RSI + 0x10))();
  if ((uVar1 & 1) == 0) {
    ::std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    pcVar2 = char_ptr_cast<float>((float *)((long)in_RSI + 0xc));
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,pcVar2,4,local_11);
    ::std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  return in_RDI;
}

Assistant:

string GetMaxValue() override {
		return HasStats() ? string(char_ptr_cast(&max), sizeof(T)) : string();
	}